

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O0

double chatra::emb::math::getDouble(Ct *ct,size_t index)

{
  uint uVar1;
  int iVar2;
  NativeReference *pNVar3;
  undefined4 extraout_var;
  IllegalArgumentException *this;
  Ct *extraout_XMM0_Qa;
  size_t index_local;
  Ct *ct_local;
  
  pNVar3 = NativeCallContext::operator[](ct,index);
  uVar1 = (*pNVar3->_vptr_NativeReference[4])();
  if ((uVar1 & 1) == 0) {
    pNVar3 = NativeCallContext::operator[](ct,index);
    uVar1 = (*pNVar3->_vptr_NativeReference[5])();
    if ((uVar1 & 1) == 0) {
      this = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      IllegalArgumentException::IllegalArgumentException
                (this,"passing argument #%zu has non-numeric value",index);
      __cxa_throw(this,&IllegalArgumentException::typeinfo,
                  IllegalArgumentException::~IllegalArgumentException);
    }
    pNVar3 = NativeCallContext::operator[](ct,index);
    (*pNVar3->_vptr_NativeReference[0xc])();
    ct_local = extraout_XMM0_Qa;
  }
  else {
    pNVar3 = NativeCallContext::operator[](ct,index);
    iVar2 = (*pNVar3->_vptr_NativeReference[0xb])();
    ct_local = (Ct *)(double)CONCAT44(extraout_var,iVar2);
  }
  return (double)ct_local;
}

Assistant:

static double getDouble(Ct& ct, size_t index = 0) {
	if (ct[index].isInt())
		return static_cast<double>(ct[index].getInt());
	if (ct[index].isFloat())
		return ct[index].getFloat();
	throw IllegalArgumentException("passing argument #%zu has non-numeric value", index);
}